

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteFrom(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  int iVar1;
  sqlite3 *db_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  WhereInfo *pWInfo_00;
  Trigger *pTVar6;
  Parse *v_00;
  WhereInfo *pWInfo_01;
  ushort uVar7;
  Expr *in_RCX;
  SrcList *in_RDX;
  Parse *in_RSI;
  Parse *in_RDI;
  ExprList *in_R8;
  long in_FS_OFFSET;
  bool bVar8;
  int count;
  char *pVTab;
  int iAddrOnce;
  u16 wcf;
  Trigger *pTrigger;
  int isView;
  int bComplex;
  int addrEphOpen;
  int addrLoop;
  int addrBypass;
  int iRowSet;
  int iEphCur;
  i16 nKey;
  int iKey;
  i16 nPk;
  int iPk;
  Index *pPk;
  u8 *aToOpen;
  int eOnePass;
  int rcauth;
  int memCnt;
  int iDb;
  sqlite3 *db;
  int nIdx;
  int iTabCur;
  Index *pIdx;
  WhereInfo *pWInfo;
  int i;
  Table *pTab;
  Vdbe *v;
  NameContext sNC;
  AuthContext sContext;
  int iIdxCur;
  int iDataCur;
  int aiCurOnePass [2];
  sqlite3 *in_stack_fffffffffffffe58;
  undefined4 uVar9;
  sqlite3 *in_stack_fffffffffffffe60;
  undefined4 uVar10;
  Pgno in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  uint in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  Parse *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  Expr *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Table *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  bool local_135;
  i16 nPk_00;
  undefined8 in_stack_fffffffffffffed0;
  u8 count_00;
  undefined4 in_stack_fffffffffffffed8;
  u8 onconf;
  u8 in_stack_fffffffffffffee8;
  uint iIdxNoSeek;
  int local_10c;
  u16 local_f6;
  u16 local_ee;
  int local_ec;
  Index *local_e8;
  void *local_e0;
  int local_d0;
  int local_c0;
  Index *local_b8;
  int local_a4;
  Parse *pPVar11;
  undefined1 local_68 [40];
  uint local_40;
  u16 wctrlFlags;
  undefined1 local_20 [8];
  undefined8 local_18;
  CollSeq *local_10;
  
  local_10 = *(CollSeq **)(in_FS_OFFSET + 0x28);
  local_20._4_4_ = 0;
  local_20._0_4_ = 0;
  wctrlFlags = 0xaaaa;
  iVar5 = -0x55555556;
  memset(local_68,0xaa,0x38);
  local_d0 = 0;
  local_18 = (Vdbe *)&DAT_aaaaaaaaaaaaaaaa;
  local_e0 = (void *)0x0;
  local_ec = 0;
  local_ee = 1;
  local_10c = 0;
  memset(&stack0xffffffffffffffd0,0,0x10);
  db_00 = in_RDI->db;
  if ((in_RDI->nErr == 0) &&
     (pWInfo_00 = (WhereInfo *)
                  sqlite3SrcListLookup
                            ((Parse *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                             (SrcList *)
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
     pWInfo_00 != (WhereInfo *)0x0)) {
    pTVar6 = sqlite3TriggersExist
                       ((Parse *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                        (Table *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                        in_stack_fffffffffffffe6c,(ExprList *)in_stack_fffffffffffffe60,
                        (int *)in_stack_fffffffffffffe58);
    bVar8 = *(u8 *)((long)&pWInfo_00->iLimit + 1) == '\x02';
    local_135 = true;
    if (pTVar6 == (Trigger *)0x0) {
      iVar2 = sqlite3FkRequired(in_stack_fffffffffffffe88,
                                (Table *)CONCAT44(in_stack_fffffffffffffe84,
                                                  in_stack_fffffffffffffe80),
                                (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                                ,in_stack_fffffffffffffe74);
      local_135 = iVar2 != 0;
    }
    iIdxNoSeek = (uint)local_135;
    iVar2 = sqlite3ViewGetColumnNames((Parse *)in_stack_fffffffffffffe58,(Table *)0x1b6d43);
    if ((iVar2 == 0) &&
       (iVar2 = sqlite3IsReadOnly((Parse *)CONCAT44(in_stack_fffffffffffffe6c,
                                                    in_stack_fffffffffffffe68),
                                  (Table *)in_stack_fffffffffffffe60,
                                  (Trigger *)in_stack_fffffffffffffe58), iVar2 == 0)) {
      sqlite3SchemaToIndex(db_00,(Schema *)pWInfo_00->revMask);
      iVar2 = sqlite3AuthCheck(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                               ,(char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ),
                               (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                              );
      if (iVar2 != 1) {
        iVar1 = in_RDI->nTab;
        in_RDI->nTab = iVar1 + 1;
        in_RSI->disableLookaside = (char)iVar1;
        in_RSI->prepFlags = (char)((uint)iVar1 >> 8);
        in_RSI->withinRJSubrtn = (char)((uint)iVar1 >> 0x10);
        in_RSI->bHasWith = (char)((uint)iVar1 >> 0x18);
        local_c0 = 0;
        for (local_b8 = (Index *)pWInfo_00->pOrderBy; local_b8 != (Index *)0x0;
            local_b8 = local_b8->pNext) {
          in_RDI->nTab = in_RDI->nTab + 1;
          local_c0 = local_c0 + 1;
        }
        if (bVar8) {
          sqlite3AuthContextPush
                    (in_RDI,(AuthContext *)&stack0xffffffffffffffd0,(char *)pWInfo_00->pParse);
        }
        v_00 = (Parse *)sqlite3GetVdbe((Parse *)in_stack_fffffffffffffe58);
        if (v_00 != (Parse *)0x0) {
          if (in_RDI->nested == '\0') {
            sqlite3VdbeCountChanges((Vdbe *)v_00);
          }
          sqlite3BeginWriteOperation
                    ((Parse *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
          if (bVar8) {
            sqlite3MaterializeView
                      ((Parse *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffeb8,
                       (Expr *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (ExprList *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
            in_RCX = (Expr *)0x0;
            in_R8 = (ExprList *)0x0;
            local_20._0_4_ = iVar1;
            local_20._4_4_ = iVar1;
          }
          memset(local_68,0,0x38);
          iVar3 = sqlite3ResolveExprNames
                            ((NameContext *)
                             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                             (Expr *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          if (iVar3 == 0) {
            if (((((db_00->flags & 0x100000000) != 0) && (in_RDI->nested == '\0')) &&
                (in_RDI->pTriggerTab == (Table *)0x0)) && (in_RDI->bReturning == '\0')) {
              local_d0 = in_RDI->nMem + 1;
              in_RDI->nMem = local_d0;
              sqlite3VdbeAddOp2((Vdbe *)in_stack_fffffffffffffe60,
                                (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                (int)in_stack_fffffffffffffe58,0);
            }
            if (((iVar2 == 0) && (in_RDX == (SrcList *)0x0)) &&
               ((iIdxNoSeek == 0 && (*(u8 *)((long)&pWInfo_00->iLimit + 1) != '\x01')))) {
              sqlite3TableLock((Parse *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ),in_stack_fffffffffffffe6c,
                               in_stack_fffffffffffffe68,
                               (u8)((ulong)in_stack_fffffffffffffe60 >> 0x38),
                               (char *)in_stack_fffffffffffffe58);
              if (((ulong)*(Expr **)&pWInfo_00->iContinue & 0x80) == 0) {
                in_stack_fffffffffffffe58 =
                     (sqlite3 *)CONCAT44((int)((ulong)in_stack_fffffffffffffe58 >> 0x20),0xffffffff)
                ;
                sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_fffffffffffffe74,
                                                   in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
                                  (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                                  (int)in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                                  in_stack_fffffffffffffe80);
              }
              for (local_b8 = (Index *)pWInfo_00->pOrderBy; local_b8 != (Index *)0x0;
                  local_b8 = local_b8->pNext) {
                if (((*(ushort *)&local_b8->field_0x63 & 3) == 2) &&
                   (((ulong)*(Expr **)&pWInfo_00->iContinue & 0x80) != 0)) {
                  sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_fffffffffffffe7c,
                                                     in_stack_fffffffffffffe78),
                                    in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                                    in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
                }
                else {
                  sqlite3VdbeAddOp2((Vdbe *)in_stack_fffffffffffffe60,
                                    (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                    (int)in_stack_fffffffffffffe58,0);
                }
              }
            }
            else {
              if ((local_40 & 0x40) != 0) {
                iIdxNoSeek = 1;
              }
              uVar7 = 8;
              if (iIdxNoSeek != 0) {
                uVar7 = 0;
              }
              if (((ulong)*(Expr **)&pWInfo_00->iContinue & 0x80) == 0) {
                local_e8 = (Index *)0x0;
                in_RDI->nMem = in_RDI->nMem + 1;
                sqlite3VdbeAddOp2((Vdbe *)in_stack_fffffffffffffe60,
                                  (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                  (int)in_stack_fffffffffffffe58,0);
                uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe60 >> 0x20);
                uVar9 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
              }
              else {
                local_e8 = sqlite3PrimaryKeyIndex((Table *)pWInfo_00);
                local_ee = local_e8->nKeyCol;
                local_ec = in_RDI->nMem + 1;
                in_RDI->nMem = (int)(short)local_ee + in_RDI->nMem;
                in_RDI->nTab = in_RDI->nTab + 1;
                local_10c = sqlite3VdbeAddOp2((Vdbe *)in_stack_fffffffffffffe60,
                                              (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                              (int)in_stack_fffffffffffffe58,0);
                uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe60 >> 0x20);
                uVar9 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
                sqlite3VdbeSetP4KeyInfo
                          ((Parse *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                           (Index *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
              }
              in_stack_fffffffffffffe58 = (sqlite3 *)CONCAT44(uVar9,(uint)(uVar7 | 0x14));
              in_stack_fffffffffffffe60 = (sqlite3 *)CONCAT44(uVar10,iVar1 + 1);
              pWInfo_01 = sqlite3WhereBegin(in_RSI,in_RDX,in_RCX,in_R8,(ExprList *)v_00,
                                            (Select *)pWInfo_00,wctrlFlags,iVar5);
              if (pWInfo_01 == (WhereInfo *)0x0) goto LAB_001b7b80;
              uVar4 = sqlite3WhereOkOnePass(pWInfo_01,(int *)&local_18);
              if (uVar4 != 1) {
                sqlite3MultiWrite(in_RDI);
              }
              iVar5 = sqlite3WhereUsesDeferredSeek(pWInfo_01);
              if (iVar5 != 0) {
                sqlite3VdbeAddOp1((Vdbe *)in_stack_fffffffffffffe60,
                                  (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                  (int)in_stack_fffffffffffffe58);
              }
              if (local_d0 != 0) {
                sqlite3VdbeAddOp2((Vdbe *)in_stack_fffffffffffffe60,
                                  (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                  (int)in_stack_fffffffffffffe58,0);
              }
              onconf = (u8)pTVar6;
              nPk_00 = (i16)in_stack_fffffffffffffed0;
              iVar5 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
              count_00 = (u8)in_stack_fffffffffffffed8;
              if (local_e8 == (Index *)0x0) {
                in_RDI->nMem = in_RDI->nMem + 1;
                sqlite3ExprCodeGetColumnOfTable
                          ((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           (Table *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                           in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
              }
              else {
                local_a4 = 0;
                while( true ) {
                  onconf = (u8)pTVar6;
                  nPk_00 = (i16)in_stack_fffffffffffffed0;
                  iVar5 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
                  count_00 = (u8)in_stack_fffffffffffffed8;
                  if ((short)local_ee <= local_a4) break;
                  sqlite3ExprCodeGetColumnOfTable
                            ((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             (Table *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
                  local_a4 = local_a4 + 1;
                }
              }
              if (uVar4 == 0) {
                if (local_e8 == (Index *)0x0) {
                  sqlite3VdbeAddOp2((Vdbe *)in_stack_fffffffffffffe60,
                                    (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                    (int)in_stack_fffffffffffffe58,0);
                }
                else {
                  in_stack_fffffffffffffe98 = in_RDI->nMem + 1;
                  in_RDI->nMem = in_stack_fffffffffffffe98;
                  in_stack_fffffffffffffe94 = (int)(short)local_ee;
                  pPVar11 = v_00;
                  sqlite3IndexAffinityStr(in_stack_fffffffffffffe58,(Index *)0x1b76c7);
                  in_stack_fffffffffffffe58 =
                       (sqlite3 *)
                       CONCAT44((int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)(short)local_ee
                               );
                  sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_fffffffffffffe74,
                                                     in_stack_fffffffffffffe70),
                                    in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
                                    (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                                    (int)in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58
                                    ,in_stack_fffffffffffffe80);
                  sqlite3VdbeAddOp4Int
                            ((Vdbe *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                             in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                             in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
                             (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
                  in_stack_fffffffffffffe88 = v_00;
                  in_stack_fffffffffffffe90 = local_ec;
                  v_00 = pPVar11;
                }
                local_f6 = (u16)(local_e8 == (Index *)0x0);
                sqlite3WhereEnd(pWInfo_00);
              }
              else {
                local_f6 = local_ee;
                local_e0 = sqlite3DbMallocRawNN
                                     ((sqlite3 *)
                                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                      (u64)in_stack_fffffffffffffe60);
                if (local_e0 == (void *)0x0) {
                  sqlite3WhereEnd(pWInfo_00);
                  goto LAB_001b7b80;
                }
                memset(local_e0,1,(long)(local_c0 + 1));
                *(undefined1 *)((long)local_e0 + (long)(local_c0 + 1)) = 0;
                if (-1 < (int)local_18) {
                  *(undefined1 *)((long)local_e0 + (long)((int)local_18 - iVar1)) = 0;
                }
                if (-1 < (long)local_18) {
                  *(undefined1 *)((long)local_e0 + (long)(local_18._4_4_ - iVar1)) = 0;
                }
                if (local_10c != 0) {
                  sqlite3VdbeChangeToNoop
                            ((Vdbe *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
                }
                sqlite3VdbeMakeLabel(in_RDI);
              }
              if (!bVar8) {
                count_00 = '\0';
                if (uVar4 == 2) {
                  iVar2 = sqlite3VdbeAddOp0((Vdbe *)in_stack_fffffffffffffe60,
                                            (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
                  count_00 = (u8)iVar2;
                }
                in_stack_fffffffffffffe58 = (sqlite3 *)(local_20 + 4);
                in_stack_fffffffffffffe60 = (sqlite3 *)local_20;
                sqlite3OpenTableAndIndices
                          ((Parse *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (Table *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                           (u8)((ulong)in_stack_fffffffffffffe88 >> 0x18),in_stack_fffffffffffffe84,
                           (u8 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           (int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                           (int *)in_stack_fffffffffffffeb8);
                if (uVar4 == 2) {
                  sqlite3VdbeJumpHereOrPopInst
                            ((Vdbe *)in_stack_fffffffffffffe60,
                             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
                }
              }
              if (uVar4 == 0) {
                if (local_e8 == (Index *)0x0) {
                  sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_fffffffffffffe7c,
                                                     in_stack_fffffffffffffe78),
                                    in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                                    in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
                }
                else {
                  sqlite3VdbeAddOp1((Vdbe *)in_stack_fffffffffffffe60,
                                    (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                    (int)in_stack_fffffffffffffe58);
                  if (*(char *)((long)&pWInfo_00->iLimit + 1) == '\x01') {
                    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_fffffffffffffe7c,
                                                       in_stack_fffffffffffffe78),
                                      in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                                      in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
                  }
                  else {
                    sqlite3VdbeAddOp2((Vdbe *)in_stack_fffffffffffffe60,
                                      (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                      (int)in_stack_fffffffffffffe58,0);
                  }
                }
              }
              else if ((*(char *)((long)&pWInfo_00->iLimit + 1) != '\x01') &&
                      (*(char *)((long)local_e0 + (long)(local_20._4_4_ - iVar1)) != '\0')) {
                sqlite3VdbeAddOp4Int
                          ((Vdbe *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                           in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
                           (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
              }
              if (*(char *)((long)&pWInfo_00->iLimit + 1) == '\x01') {
                sqlite3GetVTable(db_00,(Table *)pWInfo_00);
                sqlite3VtabMakeWritable
                          ((Parse *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           (Table *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
                sqlite3MayAbort(in_RDI);
                if ((uVar4 == 1) &&
                   (sqlite3VdbeAddOp1((Vdbe *)in_stack_fffffffffffffe60,
                                      (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                                      (int)in_stack_fffffffffffffe58),
                   in_RDI->pToplevel == (Parse *)0x0)) {
                  in_RDI->isMultiWrite = '\0';
                }
                in_stack_fffffffffffffe58 =
                     (sqlite3 *)CONCAT44((int)((ulong)in_stack_fffffffffffffe58 >> 0x20),0xfffffff5)
                ;
                sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_fffffffffffffe74,
                                                   in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
                                  (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                                  (int)in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                                  in_stack_fffffffffffffe80);
                sqlite3VdbeChangeP5((Vdbe *)v_00,2);
              }
              else {
                in_stack_fffffffffffffe58 =
                     (sqlite3 *)
                     CONCAT44((int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)(short)local_f6);
                in_stack_fffffffffffffe60 =
                     (sqlite3 *)
                     CONCAT44((int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                              (uint)(in_RDI->nested == '\0'));
                in_stack_fffffffffffffe68 = 0xb;
                in_stack_fffffffffffffe70 = uVar4 & 0xff;
                sqlite3GenerateRowDelete
                          ((Parse *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           in_stack_fffffffffffffeb8,
                           (Trigger *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                           in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,iVar5,nPk_00,count_00
                           ,onconf,in_stack_fffffffffffffee8,iIdxNoSeek);
              }
              if (uVar4 == 0) {
                iVar5 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
                if (local_e8 == (Index *)0x0) {
                  sqlite3VdbeGoto((Vdbe *)in_stack_fffffffffffffe60,iVar5);
                  sqlite3VdbeJumpHere((Vdbe *)in_stack_fffffffffffffe60,
                                      (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
                }
                else {
                  sqlite3VdbeAddOp2((Vdbe *)in_stack_fffffffffffffe60,iVar5,
                                    (int)in_stack_fffffffffffffe58,0);
                  sqlite3VdbeJumpHere((Vdbe *)in_stack_fffffffffffffe60,
                                      (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
                }
              }
              else {
                sqlite3VdbeResolveLabel
                          ((Vdbe *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                           in_stack_fffffffffffffe6c);
                sqlite3WhereEnd(pWInfo_00);
              }
            }
            if ((in_RDI->nested == '\0') && (in_RDI->pTriggerTab == (Table *)0x0)) {
              sqlite3AutoincrementEnd((Parse *)0x1b7b59);
            }
            if (local_d0 != 0) {
              sqlite3CodeChangeCount
                        ((Vdbe *)in_stack_fffffffffffffe60,
                         (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(char *)0x1b7b7e);
            }
          }
        }
      }
    }
  }
LAB_001b7b80:
  sqlite3AuthContextPop((AuthContext *)&stack0xffffffffffffffd0);
  sqlite3SrcListDelete
            ((sqlite3 *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (SrcList *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  sqlite3ExprDelete(in_stack_fffffffffffffe60,(Expr *)in_stack_fffffffffffffe58);
  if (local_e0 != (void *)0x0) {
    sqlite3DbNNFreeNN((sqlite3 *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                      (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  }
  if (*(CollSeq **)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteFrom(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table from which we should delete things */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  ExprList *pOrderBy,    /* ORDER BY clause. May be null */
  Expr *pLimit           /* LIMIT clause. May be null */
){
  Vdbe *v;               /* The virtual database engine */
  Table *pTab;           /* The table from which records will be deleted */
  int i;                 /* Loop counter */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Index *pIdx;           /* For looping over indices of the table */
  int iTabCur;           /* Cursor number for the table */
  int iDataCur = 0;      /* VDBE cursor for the canonical data source */
  int iIdxCur = 0;       /* Cursor number of the first index */
  int nIdx;              /* Number of indices */
  sqlite3 *db;           /* Main database structure */
  AuthContext sContext;  /* Authorization context */
  NameContext sNC;       /* Name context to resolve expressions in */
  int iDb;               /* Database number */
  int memCnt = 0;        /* Memory cell used for change counting */
  int rcauth;            /* Value returned by authorization callback */
  int eOnePass;          /* ONEPASS_OFF or _SINGLE or _MULTI */
  int aiCurOnePass[2];   /* The write cursors opened by WHERE_ONEPASS */
  u8 *aToOpen = 0;       /* Open cursor iTabCur+j if aToOpen[j] is true */
  Index *pPk;            /* The PRIMARY KEY index on the table */
  int iPk = 0;           /* First of nPk registers holding PRIMARY KEY value */
  i16 nPk = 1;           /* Number of columns in the PRIMARY KEY */
  int iKey;              /* Memory cell holding key of row to be deleted */
  i16 nKey;              /* Number of memory cells in the row key */
  int iEphCur = 0;       /* Ephemeral table holding all primary key values */
  int iRowSet = 0;       /* Register for rowset of rows to delete */
  int addrBypass = 0;    /* Address of jump over the delete logic */
  int addrLoop = 0;      /* Top of the delete loop */
  int addrEphOpen = 0;   /* Instruction to open the Ephemeral table */
  int bComplex;          /* True if there are triggers or FKs or
                         ** subqueries in the WHERE clause */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                  /* True if attempting to delete from a view */
  Trigger *pTrigger;           /* List of table triggers, if required */
#endif

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  assert( db->pParse==pParse );
  if( pParse->nErr ){
    goto delete_from_cleanup;
  }
  assert( db->mallocFailed==0 );
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to delete.  This table has to be
  ** put in an SrcList structure because some of the subroutines we
  ** will be calling are designed to work with multiple tables and expect
  ** an SrcList* parameter instead of just a Table* parameter.
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 )  goto delete_from_cleanup;

  /* Figure out if we have any triggers and if the table being
  ** deleted from is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
  isView = IsView(pTab);
#else
# define pTrigger 0
# define isView 0
#endif
  bComplex = pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0);
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x10000 ){
    sqlite3TreeViewLine(0, "In sqlite3Delete() at %s:%d", __FILE__, __LINE__);
    sqlite3TreeViewDelete(pParse->pWith, pTabList, pWhere,
                          pOrderBy, pLimit, pTrigger);
  }
#endif

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( !isView ){
    pWhere = sqlite3LimitWhere(
        pParse, pTabList, pWhere, pOrderBy, pLimit, "DELETE"
    );
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* If pTab is really a view, make sure it has been initialized.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto delete_from_cleanup;
  }

  if( sqlite3IsReadOnly(pParse, pTab, pTrigger) ){
    goto delete_from_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  rcauth = sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0,
                            db->aDb[iDb].zDbSName);
  assert( rcauth==SQLITE_OK || rcauth==SQLITE_DENY || rcauth==SQLITE_IGNORE );
  if( rcauth==SQLITE_DENY ){
    goto delete_from_cleanup;
  }
  assert(!isView || pTrigger);

  /* Assign cursor numbers to the table and all its indices.
  */
  assert( pTabList->nSrc==1 );
  iTabCur = pTabList->a[0].iCursor = pParse->nTab++;
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){
    pParse->nTab++;
  }

  /* Start the view context
  */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* Begin generating code.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto delete_from_cleanup;
  }
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, bComplex, iDb);

  /* If we are trying to delete from a view, realize that view into
  ** an ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab,
        pWhere, pOrderBy, pLimit, iTabCur
    );
    iDataCur = iIdxCur = iTabCur;
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* Resolve the column names in the WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto delete_from_cleanup;
  }

  /* Initialize the counter of the number of rows deleted, if
  ** we are counting rows.
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
   && !pParse->bReturning
  ){
    memCnt = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, memCnt);
  }

#ifndef SQLITE_OMIT_TRUNCATE_OPTIMIZATION
  /* Special case: A DELETE without a WHERE clause deletes everything.
  ** It is easier just to erase the whole table. Prior to version 3.6.5,
  ** this optimization caused the row change count (the value returned by
  ** API function sqlite3_count_changes) to be set incorrectly.
  **
  ** The "rcauth==SQLITE_OK" terms is the
  ** IMPLEMENTATION-OF: R-17228-37124 If the action code is SQLITE_DELETE and
  ** the callback returns SQLITE_IGNORE then the DELETE operation proceeds but
  ** the truncate optimization is disabled and all rows are deleted
  ** individually.
  */
  if( rcauth==SQLITE_OK
   && pWhere==0
   && !bComplex
   && !IsVirtual(pTab)
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
   && db->xPreUpdateCallback==0
#endif
  ){
    assert( !isView );
    sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp4(v, OP_Clear, pTab->tnum, iDb, memCnt ? memCnt : -1,
                        pTab->zName, P4_STATIC);
    }
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->pSchema==pTab->pSchema );
      if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Clear, pIdx->tnum, iDb, memCnt ? memCnt : -1);
      }else{
        sqlite3VdbeAddOp2(v, OP_Clear, pIdx->tnum, iDb);
      }
    }
  }else
#endif /* SQLITE_OMIT_TRUNCATE_OPTIMIZATION */
  {
    u16 wcf = WHERE_ONEPASS_DESIRED|WHERE_DUPLICATES_OK;
    if( sNC.ncFlags & NC_Subquery ) bComplex = 1;
    wcf |= (bComplex ? 0 : WHERE_ONEPASS_MULTIROW);
    if( HasRowid(pTab) ){
      /* For a rowid table, initialize the RowSet to an empty set */
      pPk = 0;
      assert( nPk==1 );
      iRowSet = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, iRowSet);
    }else{
      /* For a WITHOUT ROWID table, create an ephemeral table used to
      ** hold all primary keys for rows to be deleted. */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      nPk = pPk->nKeyCol;
      iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      iEphCur = pParse->nTab++;
      addrEphOpen = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, iEphCur, nPk);
      sqlite3VdbeSetP4KeyInfo(pParse, pPk);
    }

    /* Construct a query to find the rowid or primary key for every row
    ** to be deleted, based on the WHERE clause. Set variable eOnePass
    ** to indicate the strategy used to implement this delete:
    **
    **  ONEPASS_OFF:    Two-pass approach - use a FIFO for rowids/PK values.
    **  ONEPASS_SINGLE: One-pass approach - at most one row deleted.
    **  ONEPASS_MULTI:  One-pass approach - any number of rows may be deleted.
    */
    pWInfo = sqlite3WhereBegin(pParse, pTabList, pWhere, 0, 0,0,wcf,iTabCur+1);
    if( pWInfo==0 ) goto delete_from_cleanup;
    eOnePass = sqlite3WhereOkOnePass(pWInfo, aiCurOnePass);
    assert( IsVirtual(pTab)==0 || eOnePass!=ONEPASS_MULTI );
    assert( IsVirtual(pTab) || bComplex || eOnePass!=ONEPASS_OFF
            || OptimizationDisabled(db, SQLITE_OnePass) );
    if( eOnePass!=ONEPASS_SINGLE ) sqlite3MultiWrite(pParse);
    if( sqlite3WhereUsesDeferredSeek(pWInfo) ){
      sqlite3VdbeAddOp1(v, OP_FinishSeek, iTabCur);
    }

    /* Keep track of the number of rows to be deleted */
    if( memCnt ){
      sqlite3VdbeAddOp2(v, OP_AddImm, memCnt, 1);
    }

    /* Extract the rowid or primary key for the current row */
    if( pPk ){
      for(i=0; i<nPk; i++){
        assert( pPk->aiColumn[i]>=0 );
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur,
                                        pPk->aiColumn[i], iPk+i);
      }
      iKey = iPk;
    }else{
      iKey = ++pParse->nMem;
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, -1, iKey);
    }

    if( eOnePass!=ONEPASS_OFF ){
      /* For ONEPASS, no need to store the rowid/primary-key. There is only
      ** one, so just keep it in its register(s) and fall through to the
      ** delete code.  */
      nKey = nPk; /* OP_Found will use an unpacked key */
      aToOpen = sqlite3DbMallocRawNN(db, nIdx+2);
      if( aToOpen==0 ){
        sqlite3WhereEnd(pWInfo);
        goto delete_from_cleanup;
      }
      memset(aToOpen, 1, nIdx+1);
      aToOpen[nIdx+1] = 0;
      if( aiCurOnePass[0]>=0 ) aToOpen[aiCurOnePass[0]-iTabCur] = 0;
      if( aiCurOnePass[1]>=0 ) aToOpen[aiCurOnePass[1]-iTabCur] = 0;
      if( addrEphOpen ) sqlite3VdbeChangeToNoop(v, addrEphOpen);
      addrBypass = sqlite3VdbeMakeLabel(pParse);
    }else{
      if( pPk ){
        /* Add the PK key for this row to the temporary table */
        iKey = ++pParse->nMem;
        nKey = 0;   /* Zero tells OP_Found to use a composite key */
        sqlite3VdbeAddOp4(v, OP_MakeRecord, iPk, nPk, iKey,
            sqlite3IndexAffinityStr(pParse->db, pPk), nPk);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iEphCur, iKey, iPk, nPk);
      }else{
        /* Add the rowid of the row to be deleted to the RowSet */
        nKey = 1;  /* OP_DeferredSeek always uses a single rowid */
        sqlite3VdbeAddOp2(v, OP_RowSetAdd, iRowSet, iKey);
      }
      sqlite3WhereEnd(pWInfo);
    }

    /* Unless this is a view, open cursors for the table we are
    ** deleting from and all its indices. If this is a view, then the
    ** only effect this statement has is to fire the INSTEAD OF
    ** triggers.
    */
    if( !isView ){
      int iAddrOnce = 0;
      if( eOnePass==ONEPASS_MULTI ){
        iAddrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      }
      testcase( IsVirtual(pTab) );
      sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, OPFLAG_FORDELETE,
                                 iTabCur, aToOpen, &iDataCur, &iIdxCur);
      assert( pPk || IsVirtual(pTab) || iDataCur==iTabCur );
      assert( pPk || IsVirtual(pTab) || iIdxCur==iDataCur+1 );
      if( eOnePass==ONEPASS_MULTI ){
        sqlite3VdbeJumpHereOrPopInst(v, iAddrOnce);
      }
    }

    /* Set up a loop over the rowids/primary-keys that were found in the
    ** where-clause loop above.
    */
    if( eOnePass!=ONEPASS_OFF ){
      assert( nKey==nPk );  /* OP_Found will use an unpacked key */
      if( !IsVirtual(pTab) && aToOpen[iDataCur-iTabCur] ){
        assert( pPk!=0 || IsView(pTab) );
        sqlite3VdbeAddOp4Int(v, OP_NotFound, iDataCur, addrBypass, iKey, nKey);
        VdbeCoverage(v);
      }
    }else if( pPk ){
      addrLoop = sqlite3VdbeAddOp1(v, OP_Rewind, iEphCur); VdbeCoverage(v);
      if( IsVirtual(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iEphCur, 0, iKey);
      }else{
        sqlite3VdbeAddOp2(v, OP_RowData, iEphCur, iKey);
      }
      assert( nKey==0 );  /* OP_Found will use a composite key */
    }else{
      addrLoop = sqlite3VdbeAddOp3(v, OP_RowSetRead, iRowSet, 0, iKey);
      VdbeCoverage(v);
      assert( nKey==1 );
    }

    /* Delete the row */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );
      sqlite3MayAbort(pParse);
      if( eOnePass==ONEPASS_SINGLE ){
        sqlite3VdbeAddOp1(v, OP_Close, iTabCur);
        if( sqlite3IsToplevel(pParse) ){
          pParse->isMultiWrite = 0;
        }
      }
      sqlite3VdbeAddOp4(v, OP_VUpdate, 0, 1, iKey, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, OE_Abort);
    }else
#endif
    {
      int count = (pParse->nested==0);    /* True to count changes */
      sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
          iKey, nKey, count, OE_Default, eOnePass, aiCurOnePass[1]);
    }

    /* End of the loop over all rowids/primary-keys. */
    if( eOnePass!=ONEPASS_OFF ){
      sqlite3VdbeResolveLabel(v, addrBypass);
      sqlite3WhereEnd(pWInfo);
    }else if( pPk ){
      sqlite3VdbeAddOp2(v, OP_Next, iEphCur, addrLoop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, addrLoop);
    }else{
      sqlite3VdbeGoto(v, addrLoop);
      sqlite3VdbeJumpHere(v, addrLoop);
    }
  } /* End non-truncate path */

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /* Return the number of rows that were deleted. If this routine is
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( memCnt ){
    sqlite3CodeChangeCount(v, memCnt, "rows deleted");
  }

delete_from_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprDelete(db, pWhere);
#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
  sqlite3ExprListDelete(db, pOrderBy);
  sqlite3ExprDelete(db, pLimit);
#endif
  if( aToOpen ) sqlite3DbNNFreeNN(db, aToOpen);
  return;
}